

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toucheventhandle.cpp
# Opt level: O3

bool __thiscall TouchEventHandle::onHandleEvent(TouchEventHandle *this,Event *e)

{
  Handle *pHVar1;
  int iVar2;
  
  if (e == (Event *)0x0) {
    return false;
  }
  if (e->_type == TYPE_TOUCH) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[TOUCH] handling touch event",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    return true;
  }
  pHVar1 = (this->super_EventHandle).super_Handle._successor;
  if (pHVar1 != (Handle *)0x0) {
    iVar2 = (*pHVar1->_vptr_Handle[2])();
    return SUB41(iVar2,0);
  }
  return false;
}

Assistant:

bool TouchEventHandle::onHandleEvent(Event* e)
{
	if (!e)
		return false;

	switch (e->getType()) {
	case Event::TYPE_TOUCH:
		cout<<"[TOUCH] handling touch event"<<endl;
		return true;
	default:
		break;
	}

	return EventHandle::onHandleEvent(e);
}